

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O0

exr_result_t
DwaCompressor_writeRelevantChannelRules
          (DwaCompressor *me,uint8_t **outPtr,uint64_t nAvail,uint64_t *nWritten)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  int iVar3;
  Classifier *me_00;
  uint64_t uVar4;
  long *in_RCX;
  Classifier *in_RDX;
  long *in_RSI;
  long in_RDI;
  char *suffix;
  exr_coding_channel_info_t *curc;
  int c;
  size_t i;
  uint16_t *ruleSize;
  uint8_t *curp;
  uint64_t nOut;
  exr_pixel_type_t in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  Classifier *in_stack_ffffffffffffff98;
  int local_4c;
  ulong local_48;
  ulong local_30;
  exr_result_t local_4;
  
  local_30 = 2;
  puVar1 = (uint16_t *)*in_RSI;
  if (in_RDX < (Classifier *)(*in_RCX + 2U)) {
    local_4 = 1;
  }
  else {
    for (local_48 = 0; local_48 < *(ulong *)(in_RDI + 0x50); local_48 = local_48 + 1) {
      for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x28); local_4c = local_4c + 1) {
        me_00 = (Classifier *)Classifier_find_suffix(in_stack_ffffffffffffff90);
        iVar3 = Classifier_match(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff8c);
        if (iVar3 != 0) {
          in_stack_ffffffffffffff90 = (char *)(*in_RCX + local_30);
          in_stack_ffffffffffffff98 = in_RDX;
          uVar4 = Classifier_size((Classifier *)0x215794);
          if (in_stack_ffffffffffffff98 < (Classifier *)(in_stack_ffffffffffffff90 + uVar4)) {
            return 1;
          }
          uVar4 = Classifier_write(me_00,(uint8_t **)in_stack_ffffffffffffff98);
          local_30 = uVar4 + local_30;
          break;
        }
      }
    }
    if (local_30 < 0x10000) {
      uVar2 = one_from_native16(0);
      *puVar1 = uVar2;
      *in_RCX = local_30 + *in_RCX;
      *in_RSI = (long)(puVar1 + 1);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

exr_result_t
DwaCompressor_writeRelevantChannelRules (
    DwaCompressor* me, uint8_t** outPtr, uint64_t nAvail, uint64_t* nWritten)
{
    uint64_t nOut = sizeof (uint16_t);

    uint8_t* curp = *outPtr;

    uint16_t* ruleSize = (uint16_t*) curp;
    curp += sizeof (uint16_t);

    if (nAvail < (*nWritten + nOut)) return EXR_ERR_OUT_OF_MEMORY;

    for (size_t i = 0; i < me->_channelRuleCount; ++i)
    {
        for (int c = 0; c < me->_numChannels; ++c)
        {
            const exr_coding_channel_info_t* curc = me->_channelData[c].chan;
            const char* suffix = Classifier_find_suffix (curc->channel_name);

            if (Classifier_match (
                    &(me->_channelRules[i]),
                    suffix,
                    (exr_pixel_type_t) curc->data_type))
            {
                if (nAvail < (*nWritten + nOut +
                              Classifier_size (&(me->_channelRules[i]))))
                    return EXR_ERR_OUT_OF_MEMORY;

                nOut += Classifier_write (&(me->_channelRules[i]), &curp);
                break;
            }
        }
    }

    if (nOut > 65535) return EXR_ERR_OUT_OF_MEMORY;
    *ruleSize = one_from_native16 ((uint16_t) nOut);
    *nWritten += nOut;

    *outPtr = curp;
    return EXR_ERR_SUCCESS;
}